

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O3

int i2r_certpol(X509V3_EXT_METHOD *method,void *ext,BIO *out,int indent)

{
  uint uVar1;
  uint uVar2;
  OPENSSL_STACK *sk;
  undefined8 *puVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  undefined8 *puVar8;
  size_t sVar9;
  ASN1_INTEGER *aint;
  size_t sVar10;
  size_t sVar11;
  undefined4 in_register_0000000c;
  char *pcVar12;
  undefined8 uVar13;
  NOTICEREF *ref;
  
  sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)ext);
  if (sVar7 != 0) {
    uVar5 = indent + 4;
    sVar7 = 0;
    do {
      puVar8 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)ext,sVar7);
      BIO_printf((BIO *)out,"%*sPolicy: ",CONCAT44(in_register_0000000c,indent),"");
      i2a_ASN1_OBJECT((BIO *)out,(ASN1_OBJECT *)*puVar8);
      BIO_puts((BIO *)out,"\n");
      sk = (OPENSSL_STACK *)puVar8[1];
      if (sk != (OPENSSL_STACK *)0x0) {
        sVar9 = OPENSSL_sk_num(sk);
        if (sVar9 != 0) {
          sVar9 = 0;
          do {
            puVar8 = (undefined8 *)OPENSSL_sk_value(sk,sVar9);
            iVar6 = OBJ_obj2nid((ASN1_OBJECT *)*puVar8);
            if (iVar6 == 0xa5) {
              BIO_printf((BIO *)out,"%*sUser Notice:\n",(ulong)(indent + 2U),"");
              puVar8 = (undefined8 *)puVar8[1];
              puVar3 = (undefined8 *)*puVar8;
              if (puVar3 != (undefined8 *)0x0) {
                BIO_printf((BIO *)out,"%*sOrganization: %.*s\n",(ulong)uVar5,"",
                           (ulong)*(uint *)*puVar3,*(undefined8 *)((uint *)*puVar3 + 2));
                sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)puVar3[1]);
                pcVar12 = "";
                if (1 < sVar11) {
                  pcVar12 = "s";
                }
                BIO_printf((BIO *)out,"%*sNumber%s: ",(ulong)uVar5,"",pcVar12);
                sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)puVar3[1]);
                if (sVar11 != 0) {
                  sVar11 = 0;
                  do {
                    aint = (ASN1_INTEGER *)OPENSSL_sk_value((OPENSSL_STACK *)puVar3[1],sVar11);
                    if (sVar11 != 0) {
                      BIO_puts((BIO *)out,", ");
                    }
                    if (aint == (ASN1_INTEGER *)0x0) {
                      BIO_puts((BIO *)out,"(null)");
                    }
                    else {
                      pcVar12 = i2s_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,aint);
                      if (pcVar12 == (char *)0x0) goto LAB_00214d63;
                      BIO_puts((BIO *)out,pcVar12);
                      OPENSSL_free(pcVar12);
                    }
                    sVar11 = sVar11 + 1;
                    sVar10 = OPENSSL_sk_num((OPENSSL_STACK *)puVar3[1]);
                  } while (sVar11 < sVar10);
                }
                BIO_puts((BIO *)out,"\n");
              }
              puVar4 = (uint *)puVar8[1];
              if (puVar4 != (uint *)0x0) {
                uVar1 = *puVar4;
                uVar13 = *(undefined8 *)(puVar4 + 2);
                pcVar12 = "%*sExplicit Text: %.*s\n";
                uVar2 = uVar5;
                goto LAB_00214d1e;
              }
            }
            else if (iVar6 == 0xa4) {
              uVar1 = *(uint *)puVar8[1];
              uVar13 = *(undefined8 *)((uint *)puVar8[1] + 2);
              pcVar12 = "%*sCPS: %.*s\n";
              uVar2 = indent + 2U;
LAB_00214d1e:
              BIO_printf((BIO *)out,pcVar12,(ulong)uVar2,"",(ulong)uVar1,uVar13);
            }
            else {
              BIO_printf((BIO *)out,"%*sUnknown Qualifier: ",(ulong)uVar5,"");
              i2a_ASN1_OBJECT((BIO *)out,(ASN1_OBJECT *)*puVar8);
              BIO_puts((BIO *)out,"\n");
            }
LAB_00214d63:
            sVar9 = sVar9 + 1;
            sVar11 = OPENSSL_sk_num(sk);
          } while (sVar9 < sVar11);
        }
      }
      sVar7 = sVar7 + 1;
      sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)ext);
    } while (sVar7 < sVar9);
  }
  return 1;
}

Assistant:

static int i2r_certpol(const X509V3_EXT_METHOD *method, void *ext, BIO *out,
                       int indent) {
  const STACK_OF(POLICYINFO) *pol =
      reinterpret_cast<const STACK_OF(POLICYINFO) *>(ext);
  // First print out the policy OIDs
  for (size_t i = 0; i < sk_POLICYINFO_num(pol); i++) {
    const POLICYINFO *pinfo = sk_POLICYINFO_value(pol, i);
    BIO_printf(out, "%*sPolicy: ", indent, "");
    i2a_ASN1_OBJECT(out, pinfo->policyid);
    BIO_puts(out, "\n");
    if (pinfo->qualifiers) {
      print_qualifiers(out, pinfo->qualifiers, indent + 2);
    }
  }
  return 1;
}